

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

SubroutineSymbol *
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,DPIImportSyntax *syntax,Scope *parent)

{
  FormalArgumentSymbol *pFVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar2;
  int iVar3;
  DataTypeSyntax *newType;
  Type *newType_00;
  iterator ppFVar4;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *pEVar5;
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *__s;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  SourceRange SVar6;
  FormalArgumentSymbol *arg;
  iterator __end2;
  iterator __begin2;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *__range2;
  bool pureError;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  bool isPure;
  SubroutineSymbol *result;
  SubroutineKind subroutineKind;
  Token nameToken;
  FunctionPrototypeSyntax *proto;
  ValueSymbol *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe18;
  Token *in_stack_fffffffffffffe20;
  SubroutineKind *in_stack_fffffffffffffe28;
  Token *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe3e;
  Symbol *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe50;
  DeclaredType *pDVar7;
  pointer local_168;
  size_t local_160;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  SourceLocation in_stack_fffffffffffffeb8;
  DiagCode in_stack_fffffffffffffec4;
  iterator local_120;
  bitmask<slang::ast::MethodFlags> local_fa;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_f8;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *in_stack_ffffffffffffff38;
  VariableLifetime in_stack_ffffffffffffff44;
  SourceLocation in_stack_ffffffffffffff48;
  SourceLocation in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  DiagCode in_stack_ffffffffffffff64;
  bitmask<slang::ast::MethodFlags> local_7e;
  bitmask<slang::ast::MethodFlags> local_7c;
  byte local_79;
  bitmask<slang::ast::DeclaredTypeFlags> local_78;
  bitmask<slang::ast::MethodFlags> local_72 [11];
  undefined4 local_5c;
  SourceLocation local_58;
  string_view local_50;
  SubroutineSymbol *local_40;
  uint local_34;
  Token local_30;
  FunctionPrototypeSyntax *local_20;
  SyntaxNode *local_10;
  Compilation *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
                       ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x6f49a3);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x6f49bc);
  local_30 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_fffffffffffffe40);
  local_34 = (uint)((local_20->keyword).kind == TaskKeyword);
  local_50 = parsing::Token::valueText(in_stack_fffffffffffffe20);
  local_58 = parsing::Token::location(&local_30);
  local_5c = 0;
  local_40 = BumpAllocator::
             emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                       ((BumpAllocator *)in_stack_fffffffffffffe50._M_extent_value,
                        (Compilation *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)
                        ,(basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffe40,
                        (SourceLocation *)
                        CONCAT26(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38),
                        (VariableLifetime *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  Symbol::setSyntax(&local_40->super_Symbol,local_10);
  std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
            ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  syntax_00._M_ptr._6_2_ = in_stack_fffffffffffffe4e;
  syntax_00._M_ptr._0_6_ = in_stack_fffffffffffffe48;
  syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffe50._M_extent_value;
  Symbol::setAttributes
            (in_stack_fffffffffffffe40,
             (Scope *)CONCAT26(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38),syntax_00);
  bitmask<slang::ast::MethodFlags>::bitmask(local_72,DPIImport);
  (local_40->flags).m_bits = local_72[0].m_bits;
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_78,DPIReturnType);
  DeclaredType::addFlags
            ((DeclaredType *)in_stack_fffffffffffffe08,
             (bitmask<slang::ast::DeclaredTypeFlags>)
             (underlying_type)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  if (local_34 == 0) {
    pDVar7 = &local_40->declaredReturnType;
    newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                        ((not_null<slang::syntax::DataTypeSyntax_*> *)0x6f4b74);
    DeclaredType::setTypeSyntax(pDVar7,newType);
  }
  else {
    pDVar7 = &local_40->declaredReturnType;
    newType_00 = Compilation::getVoidType(local_8);
    DeclaredType::setType(pDVar7,newType_00);
  }
  local_79 = 0;
  if (*(short *)&local_10[4].previewNode == 0x7f) {
    bitmask<slang::ast::MethodFlags>::bitmask(&local_7e,DPIContext);
    bitmask<slang::ast::MethodFlags>::operator|=(&local_40->flags,&local_7e);
  }
  else if (*(short *)&local_10[4].previewNode == 0xf8) {
    local_79 = 1;
    bitmask<slang::ast::MethodFlags>::bitmask(&local_7c,Pure);
    bitmask<slang::ast::MethodFlags>::operator|=(&local_40->flags,&local_7c);
  }
  parsing::Token::valueText(in_stack_fffffffffffffe20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe20,
             (char *)in_stack_fffffffffffffe18);
  __x._M_len._6_2_ = in_stack_fffffffffffffe3e;
  __x._M_len._0_6_ = in_stack_fffffffffffffe38;
  __x._M_str = (char *)in_stack_fffffffffffffe40;
  __y._M_str = (char *)in_stack_fffffffffffffe30;
  __y._M_len = (size_t)in_stack_fffffffffffffe28;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    in_stack_ffffffffffffff5c = 0xea0006;
    SVar6 = parsing::Token::range(in_stack_fffffffffffffe30);
    in_stack_ffffffffffffff48 = SVar6.startLoc;
    in_stack_ffffffffffffff50 = SVar6.endLoc;
    SVar6.endLoc._0_4_ = in_stack_ffffffffffffff58;
    SVar6.startLoc = in_stack_ffffffffffffff50;
    SVar6.endLoc._4_4_ = in_stack_ffffffffffffff5c;
    Scope::addDiag((Scope *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff64,SVar6);
  }
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x6f4d13);
  if (local_20->portList != (FunctionPortListSyntax *)0x0) {
    local_fa = buildArguments((Scope *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                              ,(Scope *)in_stack_ffffffffffffff50,
                              (FunctionPortListSyntax *)in_stack_ffffffffffffff48,
                              in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    bitmask<slang::ast::MethodFlags>::operator|=(&local_40->flags,&local_fa);
  }
  bVar2 = false;
  local_120 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::begin(&local_f8);
  ppFVar4 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::end(&local_f8);
  pEVar5 = extraout_RDX;
  for (; local_120 != ppFVar4; local_120 = local_120 + 1) {
    pFVar1 = *local_120;
    ValueSymbol::getDeclaredType(in_stack_fffffffffffffe08);
    not_null<slang::ast::DeclaredType_*>::operator->
              ((not_null<slang::ast::DeclaredType_*> *)0x6f4e4c);
    bitmask<slang::ast::DeclaredTypeFlags>::bitmask
              ((bitmask<slang::ast::DeclaredTypeFlags> *)&stack0xfffffffffffffec4,DPIArg);
    DeclaredType::addFlags
              ((DeclaredType *)in_stack_fffffffffffffe08,
               (bitmask<slang::ast::DeclaredTypeFlags>)
               (underlying_type)((ulong)in_stack_fffffffffffffe10 >> 0x20));
    if (pFVar1->direction == Ref) {
      in_stack_fffffffffffffeb8 =
           (pFVar1->super_VariableSymbol).super_ValueSymbol.super_Symbol.location;
      Scope::addDiag((Scope *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
      pEVar5 = extraout_RDX_01;
    }
    else {
      pEVar5 = extraout_RDX_00;
      if ((((pFVar1->direction == Out) || (pFVar1->direction == InOut)) && ((local_79 & 1) != 0)) &&
         (!bVar2)) {
        in_stack_fffffffffffffeb4 = 0x250006;
        Scope::addDiag((Scope *)CONCAT44(0x250006,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffec4,in_stack_fffffffffffffeb8);
        bVar2 = true;
        pEVar5 = extraout_RDX_02;
      }
    }
  }
  iVar3 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                    (&local_f8,(EVP_PKEY_CTX *)local_8,pEVar5);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar3),__s);
  (local_40->arguments)._M_ptr = local_168;
  (local_40->arguments)._M_extent._M_extent_value = local_160;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x6f4ff2);
  return local_40;
}

Assistant:

SubroutineSymbol& SubroutineSymbol::fromSyntax(Compilation& compilation,
                                               const DPIImportSyntax& syntax, const Scope& parent) {
    auto& proto = *syntax.method;
    Token nameToken = proto.name->getLastToken();
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(),
                                                        VariableLifetime::Automatic,
                                                        subroutineKind);
    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);
    result->flags = MethodFlags::DPIImport;

    result->declaredReturnType.addFlags(DeclaredTypeFlags::DPIReturnType);
    if (subroutineKind == SubroutineKind::Function)
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(compilation.getVoidType());

    bool isPure = false;
    switch (syntax.property.kind) {
        case TokenKind::PureKeyword:
            isPure = true;
            result->flags |= MethodFlags::Pure;
            break;
        case TokenKind::ContextKeyword:
            result->flags |= MethodFlags::DPIContext;
            break;
        default:
            break;
    }

    if (syntax.specString.valueText() == "DPI")
        parent.addDiag(diag::DPISpecDisallowed, syntax.specString.range());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, parent, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    // Check arguments for extra rules imposed by DPI imports.
    bool pureError = false;
    for (auto arg : arguments) {
        const_cast<FormalArgumentSymbol*>(arg)->getDeclaredType()->addFlags(
            DeclaredTypeFlags::DPIArg);

        if (arg->direction == ArgumentDirection::Ref)
            parent.addDiag(diag::DPIRefArg, arg->location);
        else if (arg->direction == ArgumentDirection::Out ||
                 arg->direction == ArgumentDirection::InOut) {
            if (isPure && !pureError) {
                parent.addDiag(diag::DPIPureArg, arg->location);
                pureError = true;
            }
        }
    }

    result->arguments = arguments.copy(compilation);
    return *result;
}